

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::FlagSaver::~FlagSaver(FlagSaver *this)

{
  FlagSaver *this_local;
  
  fLI::FLAGS_v = this->v_;
  fLI::FLAGS_stderrthreshold = this->stderrthreshold_;
  fLB::FLAGS_logtostderr = this->logtostderr_ & 1;
  fLB::FLAGS_alsologtostderr = this->alsologtostderr_ & 1;
  std::__cxx11::string::operator=
            ((string *)fLS::FLAGS_logmailer_buf_abi_cxx11_,(string *)&this->logmailer_);
  std::__cxx11::string::~string((string *)&this->logmailer_);
  return;
}

Assistant:

~FlagSaver() {
    FLAGS_v = v_;
    FLAGS_stderrthreshold = stderrthreshold_;
    FLAGS_logtostderr = logtostderr_;
    FLAGS_alsologtostderr = alsologtostderr_;
    FLAGS_logmailer = logmailer_;
  }